

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenMap.cpp
# Opt level: O2

void __thiscall OpenMD::TokenMap::TokenMap(TokenMap *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_91;
  any local_90;
  Token local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  local_48;
  
  p_Var1 = &(this->tokenMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"define",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x301,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_48,(char (*) [7])0x24ff28,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"select",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x302,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_48,(char (*) [7])"select",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"(",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x400,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x243106,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,")",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x401,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x242f2c,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"and",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x403,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>(&local_48,(char (*) [4])"and",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"and",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x403,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x252104,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"and",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x403,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])"&&",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"or",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x404,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])0x2404fb,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"or",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x404,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x240e08,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"or",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x404,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x252107,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"or",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x404,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])"||",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"not",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x405,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>(&local_48,(char (*) [4])"not",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"not",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x405,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x23f375,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"<",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x3403,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x242f95,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"<=",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x3402,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])"<=",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,">=",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x3401,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])">=",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,">",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x3400,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x242672,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"==",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x3404,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])0x2432d2,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"!=",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x3405,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])"!=",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"within",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1406,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_48,(char (*) [7])"within",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,".",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x408,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x24b82b,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"mass",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c00,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>(&local_48,(char (*) [5])"mass",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"charge",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c01,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_48,(char (*) [7])"charge",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"hull",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x140c,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>(&local_48,(char (*) [5])0x24c464,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"alphahull",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x140d,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[10],_OpenMD::Token,_true>(&local_48,(char (*) [10])"alphahull",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"x",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c02,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x243317,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"y",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c03,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x249f93,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"z",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c04,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x249f99,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"wrappedx",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c06,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>(&local_48,(char (*) [9])"wrappedx",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"wrappedy",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c07,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>(&local_48,(char (*) [9])"wrappedy",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"wrappedz",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c08,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>(&local_48,(char (*) [9])"wrappedz",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"atomno",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c09,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_48,(char (*) [7])"atomno",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"r",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x1c05,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_48,(char (*) [2])0x24306c,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"to",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x402,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_48,(char (*) [3])0x246fc0,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"all",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x409,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>(&local_48,(char (*) [4])0x249e05,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"none",&local_91);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_90,&local_68);
  Token::Token(&local_80,0x40a,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>(&local_48,(char (*) [5])0x24d02b,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(&local_48);
  std::any::reset(&local_80.value);
  std::any::reset(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TokenMap::TokenMap() {
    tokenMap_.insert(TokenMapType::value_type(
        "define", Token(Token::define, std::string("define"))));
    tokenMap_.insert(TokenMapType::value_type(
        "select", Token(Token::select, std::string("select"))));
    // tokenMap_.insert(TokenMapType::value_type("selected",
    // Token(Token::selected, std::string("selected"))));

    // expressions
    tokenMap_.insert(TokenMapType::value_type(
        "(", Token(Token::leftparen, std::string("("))));
    tokenMap_.insert(TokenMapType::value_type(
        ")", Token(Token::rightparen, std::string(")"))));

    tokenMap_.insert(TokenMapType::value_type(
        "and", Token(Token::opAnd, std::string("and"))));
    tokenMap_.insert(
        TokenMapType::value_type("&", Token(Token::opAnd, std::string("and"))));
    tokenMap_.insert(TokenMapType::value_type(
        "&&", Token(Token::opAnd, std::string("and"))));

    tokenMap_.insert(
        TokenMapType::value_type("or", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type(",", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type("|", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type("||", Token(Token::opOr, std::string("or"))));

    tokenMap_.insert(TokenMapType::value_type(
        "not", Token(Token::opNot, std::string("not"))));
    tokenMap_.insert(
        TokenMapType::value_type("!", Token(Token::opNot, std::string("not"))));

    tokenMap_.insert(
        TokenMapType::value_type("<", Token(Token::opLT, std::string("<"))));
    tokenMap_.insert(
        TokenMapType::value_type("<=", Token(Token::opLE, std::string("<="))));
    tokenMap_.insert(
        TokenMapType::value_type(">=", Token(Token::opGE, std::string(">="))));
    tokenMap_.insert(
        TokenMapType::value_type(">", Token(Token::opGT, std::string(">"))));
    tokenMap_.insert(
        TokenMapType::value_type("==", Token(Token::opEQ, std::string("=="))));
    tokenMap_.insert(
        TokenMapType::value_type("!=", Token(Token::opNE, std::string("!="))));
    tokenMap_.insert(TokenMapType::value_type(
        "within", Token(Token::within, std::string("within"))));
    tokenMap_.insert(
        TokenMapType::value_type(".", Token(Token::dot, std::string("."))));
    tokenMap_.insert(TokenMapType::value_type(
        "mass", Token(Token::mass, std::string("mass"))));
    tokenMap_.insert(TokenMapType::value_type(
        "charge", Token(Token::charge, std::string("charge"))));
    tokenMap_.insert(TokenMapType::value_type(
        "hull", Token(Token::hull, std::string("hull"))));
    tokenMap_.insert(TokenMapType::value_type(
        "alphahull", Token(Token::alphahull, std::string("alphahull"))));
    tokenMap_.insert(
        TokenMapType::value_type("x", Token(Token::x, std::string("x"))));
    tokenMap_.insert(
        TokenMapType::value_type("y", Token(Token::y, std::string("y"))));
    tokenMap_.insert(
        TokenMapType::value_type("z", Token(Token::z, std::string("z"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedx", Token(Token::wrappedX, std::string("wrappedx"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedy", Token(Token::wrappedY, std::string("wrappedy"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedz", Token(Token::wrappedZ, std::string("wrappedz"))));
    tokenMap_.insert(TokenMapType::value_type(
        "atomno", Token(Token::atomno, std::string("atomno"))));
    tokenMap_.insert(
        TokenMapType::value_type("r", Token(Token::r, std::string("r"))));
    tokenMap_.insert(
        TokenMapType::value_type("to", Token(Token::to, std::string("to"))));

    tokenMap_.insert(
        TokenMapType::value_type("all", Token(Token::all, std::string("all"))));
    tokenMap_.insert(TokenMapType::value_type(
        "none", Token(Token::none, std::string("none"))));
  }